

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  ImplicitDependLanguageMap *pIVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  cmOutputConverter *pcVar12;
  cmValue cVar13;
  cmState *pcVar14;
  string *psVar15;
  _Base_ptr p_Var16;
  cmOutputConverter *pcVar17;
  char *extraout_RDX;
  string *tr;
  long lVar18;
  cmLocalUnixMakefileGenerator3 *pcVar19;
  pointer pbVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  _Rb_tree_header *p_Var21;
  char *pcVar22;
  undefined1 *in_R8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *di;
  iterator __first;
  ImplicitDependLanguageMap *__range1;
  pointer pcVar23;
  string *include;
  long lVar24;
  string *psVar25;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view str_00;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string cidVar;
  undefined1 local_118 [32];
  cmOutputConverter *local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [24];
  _Base_ptr local_d0;
  char *local_c8;
  ostream *local_c0;
  _Rb_tree_node_base *local_b8;
  undefined1 local_b0 [32];
  cmGeneratorTarget *local_90;
  cmLocalUnixMakefileGenerator3 *local_88;
  cmOutputConverter *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Base_ptr local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# Consider dependencies only in project.\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_IN_PROJECT_ONLY ",0x22);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_f0 = (undefined1  [8])(local_e8 + 8);
  local_88 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_f0);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar7->_M_dataplus)._M_p;
  bVar5 = cmValue::IsOn((cmValue *)psVar7->_M_string_length,value);
  pcVar22 = "OFF";
  if (bVar5) {
    pcVar22 = "ON";
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,pcVar22,(ulong)bVar5 ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,")\n\n",3);
  if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
    operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
  }
  local_90 = target;
  pIVar8 = GetImplicitDepends_abi_cxx11_(local_88,target,CMake);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of languages for which implicit dependencies are needed:\n",
             0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n",0x1c);
  p_Var21 = &(pIVar8->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var10 = (pIVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != p_Var21;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (cmakefileStream,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  pcVar19 = local_88;
  local_c0 = cmakefileStream;
  if ((pIVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (cmakefileStream,"# The set of files for implicit dependencies of each language:\n",
               0x3f);
    p_Var16 = (pIVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = &p_Var21->_M_header;
    if ((_Rb_tree_header *)p_Var16 != p_Var21) {
      local_80 = &(pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_DEPENDS_CHECK_",0x18);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(p_Var16 + 1),(long)p_Var16[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        pcVar12 = (cmOutputConverter *)p_Var16[2]._M_right;
        local_f8 = (cmOutputConverter *)&p_Var16[2]._M_parent;
        local_b8 = p_Var16;
        if (pcVar12 != local_f8) {
          do {
            poVar9 = local_c0;
            pcVar2 = (pointer)(pcVar12->RelativePathTopBinary)._M_string_length;
            for (pcVar23 = (pcVar12->RelativePathTopBinary)._M_dataplus._M_p; pcVar23 != pcVar2;
                pcVar23 = pcVar23 + 0x20) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  \"",3);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar9,*(char **)pcVar23,*(long *)(pcVar23 + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar9,(pcVar12->RelativePathTopSource)._M_dataplus._M_p,
                                   (pcVar12->RelativePathTopSource)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"\n",2);
            }
            pcVar12 = (cmOutputConverter *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar12);
          } while (pcVar12 != local_f8);
        }
        cmakefileStream = local_c0;
        std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  )\n",4);
        p_Var10 = local_b8;
        local_e8._16_8_ = *(undefined8 *)(local_b8 + 1);
        local_e8._8_8_ = local_b8[1]._M_parent;
        local_f0 = (undefined1  [8])0x6;
        local_e8._0_8_ = "CMAKE_";
        local_d0 = (_Base_ptr)0xc;
        local_c8 = "_COMPILER_ID";
        views._M_len = 3;
        views._M_array = (iterator)local_f0;
        cmCatViews_abi_cxx11_(&local_50,views);
        pcVar19 = local_88;
        cVar13 = cmMakefile::GetDefinition
                           ((local_88->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile
                            ,&local_50);
        if ((cVar13.Value != (string *)0x0) && ((cVar13.Value)->_M_string_length != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_COMPILER_ID \"",0xe);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,((cVar13.Value)->_M_dataplus)._M_p,
                              (cVar13.Value)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
        }
        p_Var16 = p_Var10 + 1;
        iVar6 = std::__cxx11::string::compare((char *)p_Var16);
        pbVar20 = (pointer)(local_118 + 0x10);
        if (iVar6 == 0) {
          pcVar1 = (pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
          local_118._0_8_ = pbVar20;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"CMAKE_Fortran_SUBMODULE_SEP","");
          psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_118);
          local_f0 = (undefined1  [8])(local_e8 + 8);
          pcVar23 = (psVar7->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,pcVar23,pcVar23 + psVar7->_M_string_length);
          if ((pointer)local_118._0_8_ != pbVar20) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          pcVar1 = (pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
          local_b0._0_8_ = local_b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,"CMAKE_Fortran_SUBMODULE_EXT","");
          psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_b0);
          pcVar23 = (psVar7->_M_dataplus)._M_p;
          local_118._0_8_ = pbVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_118,pcVar23,pcVar23 + psVar7->_M_string_length);
          if ((pointer)local_b0._0_8_ != (pointer)(local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_SEP \"",0x21);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,(char *)local_f0,local_e8._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_Fortran_SUBMODULE_EXT \"",0x21);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
          if ((pointer)local_118._0_8_ != pbVar20) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
            operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
          }
        }
        local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
        local_e8._8_8_ = (_Base_ptr)0x0;
        local_e8._16_8_ = local_e8;
        local_c8 = (char *)0x0;
        local_d0 = (_Base_ptr)local_e8._16_8_;
        GetConfigName_abi_cxx11_((string *)local_118,pcVar19);
        defines_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f0;
        cmLocalGenerator::GetTargetDefines
                  ((cmLocalGenerator *)pcVar19,local_90,(string *)local_118,(string *)p_Var16,
                   defines_00);
        if ((pointer)local_118._0_8_ != pbVar20) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        if (local_c8 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"# Preprocessor definitions for this target.\n",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (cmakefileStream,"set(CMAKE_TARGET_DEFINITIONS_",0x1d);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,*(char **)(local_b8 + 1),(long)local_b8[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          for (p_Var10 = (_Rb_tree_node_base *)local_e8._16_8_;
              p_Var10 != (_Rb_tree_node_base *)local_e8;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
            str._M_str = (char *)0x0;
            str._M_len = *(ulong *)(p_Var10 + 1);
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)local_118,(cmOutputConverter *)p_Var10[1]._M_parent,str,
                       (WrapQuotes)defines_00);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((pointer)local_118._0_8_ != pbVar20) {
              operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"# The include file search paths:\n",0x21);
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(local_b8 + 1),(long)local_b8[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_TARGET_INCLUDE_PATH\n",0x15);
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetConfigName_abi_cxx11_((string *)local_118,pcVar19);
        in_R8 = local_118;
        cmLocalGenerator::GetIncludeDirectories
                  ((cmLocalGenerator *)pcVar19,&local_78,local_90,(string *)p_Var16,
                   (string *)local_118);
        if ((pointer)local_118._0_8_ != pbVar20) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)pcVar19);
        psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar14);
        pcVar1 = (pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_118._0_8_ = pbVar20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"CMAKE_DEPENDS_IN_PROJECT_ONLY","");
        bVar5 = cmMakefile::IsOn(pcVar1,(string *)local_118);
        if ((pointer)local_118._0_8_ != pbVar20) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
        pcVar12 = (cmOutputConverter *)
                  local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar17 = (cmOutputConverter *)
                  local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar5) {
          pcVar14 = cmLocalGenerator::GetState((cmLocalGenerator *)pcVar19);
          psVar15 = cmState::GetSourceDirectory_abi_cxx11_(pcVar14);
          local_118._8_8_ = (psVar15->_M_dataplus)._M_p;
          local_118._0_8_ = psVar15->_M_string_length;
          local_118._24_8_ = (psVar7->_M_dataplus)._M_p;
          local_118._16_8_ = psVar7->_M_string_length;
          local_f8 = (cmOutputConverter *)
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar18 = (long)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (cmOutputConverter *)
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_b0._0_8_ = local_118._0_8_;
          local_b0._8_8_ = local_118._8_8_;
          local_b0._16_8_ = local_118._16_8_;
          local_b0._24_8_ = local_118._24_8_;
          if (0 < lVar18 >> 7) {
            lVar24 = (lVar18 >> 7) + 1;
            pcVar17 = (cmOutputConverter *)
                      ((long)local_78.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x40);
            do {
              pcVar12 = pcVar17;
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)pcVar12[-1].RelativePathTopSource._M_string_length);
              if (bVar5) {
                pcVar17 = local_f8;
                pcVar12 = (cmOutputConverter *)&pcVar12[-1].RelativePathTopSource._M_string_length;
                goto LAB_004fa5f1;
              }
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)pcVar12[-1].RelativePathTopBinary._M_string_length);
              if (bVar5) {
                pcVar17 = local_f8;
                pcVar12 = (cmOutputConverter *)&pcVar12[-1].RelativePathTopBinary._M_string_length;
                goto LAB_004fa5f1;
              }
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)(pcVar12->StateSnapshot).State);
              pcVar17 = local_f8;
              if (bVar5) goto LAB_004fa5f1;
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)(pcVar12->RelativePathTopSource)._M_dataplus._M_p);
              if (bVar5) {
                pcVar17 = local_f8;
                pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopSource;
                goto LAB_004fa5f1;
              }
              lVar24 = lVar24 + -1;
              lVar18 = lVar18 + -0x80;
              pcVar17 = (cmOutputConverter *)&pcVar12[1].LinkScriptShell;
            } while (1 < lVar24);
            pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopBinary;
          }
          lVar18 = lVar18 >> 5;
          pcVar17 = local_f8;
          if (lVar18 == 1) {
LAB_004fa5c9:
            bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                              ((NotInProjectDir *)local_118,(string *)(pcVar12->StateSnapshot).State
                              );
            if (!bVar5) {
              pcVar12 = pcVar17;
            }
LAB_004fa5f1:
            psVar25 = (string *)&pcVar12->RelativePathTopSource;
            __first._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12;
            if ((cmOutputConverter *)psVar25 != pcVar17 && pcVar12 != pcVar17) {
              do {
                bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                  ((NotInProjectDir *)local_b0,*(string **)&psVar25->field_0x0);
                if (!bVar5) {
                  std::__cxx11::string::operator=((string *)pcVar12,psVar25);
                  pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopSource;
                }
                psVar25 = psVar25 + 0x20;
                __first._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12;
              } while ((cmOutputConverter *)psVar25 != pcVar17);
            }
          }
          else {
            if (lVar18 == 2) {
LAB_004fa5aa:
              pcVar17 = local_f8;
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)(pcVar12->StateSnapshot).State);
              if (!bVar5) {
                pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopSource;
                goto LAB_004fa5c9;
              }
              goto LAB_004fa5f1;
            }
            __first._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
            if (lVar18 == 3) {
              bVar5 = anon_unknown.dwarf_2091930::NotInProjectDir::operator()
                                ((NotInProjectDir *)local_118,
                                 (string *)(pcVar12->StateSnapshot).State);
              pcVar17 = local_f8;
              if (!bVar5) {
                pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopSource;
                goto LAB_004fa5aa;
              }
              goto LAB_004fa5f1;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase(&local_78,__first,
                     (iterator)
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          pcVar12 = (cmOutputConverter *)
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cmOutputConverter *)
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar4 = local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            pcVar12 !=
            (cmOutputConverter *)
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
            pcVar12 = (cmOutputConverter *)&pcVar12->RelativePathTopSource) {
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar17;
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
          cmOutputConverter::MaybeRelativeToTopBinDir
                    ((string *)local_118,local_80,(string *)pcVar12);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,(char *)local_118._0_8_,local_118._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
          if ((pointer)local_118._0_8_ != pbVar20) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          pcVar17 = (cmOutputConverter *)
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar17;
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
        pcVar19 = local_88;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_b8);
      } while (p_Var16 != local_58);
    }
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_118._16_8_ = (pointer)0x0;
    pcVar1 = (pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    local_f0 = (undefined1  [8])(local_e8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
    cVar13 = cmMakefile::GetProperty(pcVar1,(string *)local_f0);
    if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
      operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
    }
    if (cVar13.Value != (string *)0x0) {
      arg._M_str = ((cVar13.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar13.Value)->_M_string_length;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_118,false);
    }
    local_f0 = (undefined1  [8])(local_e8 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
    cVar13 = cmGeneratorTarget::GetProperty(local_90,(string *)local_f0);
    if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
      operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
    }
    if (cVar13.Value != (string *)0x0) {
      arg_00._M_str = ((cVar13.Value)->_M_dataplus)._M_p;
      arg_00._M_len = (cVar13.Value)->_M_string_length;
      cmExpandList(arg_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_118,false);
    }
    if (local_118._0_8_ != local_118._8_8_) {
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"\nset(CMAKE_INCLUDE_TRANSFORMS\n",0x1e);
      uVar3 = local_118._8_8_;
      if (local_118._0_8_ != local_118._8_8_) {
        pbVar20 = (pointer)local_118._0_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  ",2);
          str_00._M_str = (char *)0x0;
          str_00._M_len = (size_t)(pbVar20->_M_dataplus)._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)local_f0,(cmOutputConverter *)pbVar20->_M_string_length,str_00,
                     (WrapQuotes)in_R8);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_c0,(char *)local_f0,local_e8._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
            operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
          }
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != (pointer)uVar3);
      }
      cmakefileStream = local_c0;
      std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  )\n",4);
      pcVar19 = local_88;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
  }
  pIVar8 = GetImplicitDepends_abi_cxx11_(pcVar19,local_90,Compiler);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"\n# The set of dependency files which are needed:\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_DEPENDENCY_FILES\n",0x23);
  p_Var16 = (pIVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90 = (cmGeneratorTarget *)&(pIVar8->_M_t)._M_impl.super__Rb_tree_header;
  if ((cmGeneratorTarget *)p_Var16 != local_90) {
    pcVar12 = &(pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    do {
      p_Var10 = *(_Rb_tree_node_base **)(p_Var16 + 1);
      local_b8 = p_Var16;
      if ((p_Var16[1]._M_parent == (_Base_ptr)0x6) &&
         (*(short *)&p_Var10->field_0x4 == 0x4d4f && p_Var10->_M_color == 0x54535543)) {
        pcVar17 = (cmOutputConverter *)p_Var16[2]._M_right;
        local_80 = (cmOutputConverter *)&p_Var16[2]._M_parent;
        if (pcVar17 != local_80) {
          do {
            psVar7 = (string *)(pcVar17->RelativePathTopBinary)._M_dataplus._M_p;
            psVar15 = (string *)(pcVar17->RelativePathTopBinary)._M_string_length;
            local_f8 = pcVar17;
            if (psVar7 != psVar15) {
              do {
                poVar9 = local_c0;
                std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  \"\" \"",6);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_f0,pcVar12,&pcVar17->RelativePathTopSource);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_f0,local_e8._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" \"custom\" \"",0xc);
                cmOutputConverter::MaybeRelativeToTopBinDir((string *)local_118,pcVar12,psVar7);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_118._0_8_,local_118._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"\n",2);
                if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
                  operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                }
                if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
                  operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
                }
                psVar7 = psVar7 + 1;
              } while (psVar7 != psVar15);
            }
            pcVar17 = (cmOutputConverter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_f8);
          } while (pcVar17 != local_80);
        }
      }
      else {
        pcVar1 = (pcVar19->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_f0 = (undefined1  [8])0x6;
        local_e8._0_8_ = "CMAKE_";
        local_d0 = (_Rb_tree_node_base *)0xf;
        local_c8 = "_DEPFILE_FORMAT";
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_f0;
        local_e8._8_8_ = p_Var16[1]._M_parent;
        local_e8._16_8_ = p_Var10;
        cmCatViews_abi_cxx11_((string *)local_b0,views_00);
        psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_b0);
        local_118._0_8_ = local_118 + 0x10;
        pcVar23 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar23,pcVar23 + psVar7->_M_string_length);
        p_Var10 = local_b8;
        if ((pointer)local_b0._0_8_ != (pointer)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
        }
        pcVar17 = (cmOutputConverter *)p_Var10[2]._M_right;
        local_80 = (cmOutputConverter *)&p_Var10[2]._M_parent;
        if (pcVar17 != local_80) {
          do {
            pcVar23 = (pcVar17->RelativePathTopBinary)._M_dataplus._M_p;
            pcVar2 = (pointer)(pcVar17->RelativePathTopBinary)._M_string_length;
            local_f8 = pcVar17;
            if (pcVar23 != pcVar2) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  \"",3);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (local_c0,*(char **)pcVar23,*(long *)(pcVar23 + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" \"",3);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_f0,pcVar12,&pcVar17->RelativePathTopSource);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_f0,local_e8._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" \"",3);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_118._0_8_,local_118._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" \"",3);
                cmOutputConverter::MaybeRelativeToTopBinDir
                          ((string *)local_b0,pcVar12,&pcVar17->RelativePathTopSource);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_b0._0_8_,local_b0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,".d\"\n",4);
                if ((pointer)local_b0._0_8_ != (pointer)(local_b0 + 0x10)) {
                  operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
                }
                if (local_f0 != (undefined1  [8])(local_e8 + 8)) {
                  operator_delete((void *)local_f0,(ulong)(local_e8._8_8_ + 1));
                }
                pcVar23 = pcVar23 + 0x20;
              } while (pcVar23 != pcVar2);
            }
            pcVar17 = (cmOutputConverter *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_f8);
          } while (pcVar17 != local_80);
        }
        if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
        }
      }
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(local_b8);
      pcVar19 = local_88;
    } while ((cmGeneratorTarget *)p_Var16 != local_90);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_c0,"  )\n",4);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo(
  std::ostream& cmakefileStream, cmGeneratorTarget* target)
{
  // To enable dependencies filtering
  cmakefileStream << "\n"
                  << "# Consider dependencies only in project.\n"
                  << "set(CMAKE_DEPENDS_IN_PROJECT_ONLY "
                  << (cmIsOn(this->Makefile->GetSafeDefinition(
                        "CMAKE_DEPENDS_IN_PROJECT_ONLY"))
                        ? "ON"
                        : "OFF")
                  << ")\n\n";

  auto const& implicitLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::CMake);

  // list the languages
  cmakefileStream << "# The set of languages for which implicit "
                     "dependencies are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for (auto const& implicitLang : implicitLangs) {
    cmakefileStream << "  \"" << implicitLang.first << "\"\n";
  }
  cmakefileStream << "  )\n";

  if (!implicitLangs.empty()) {
    // now list the files for each language
    cmakefileStream
      << "# The set of files for implicit dependencies of each language:\n";
    for (auto const& implicitLang : implicitLangs) {
      const auto& lang = implicitLang.first;

      cmakefileStream << "set(CMAKE_DEPENDS_CHECK_" << lang << "\n";
      auto const& implicitPairs = implicitLang.second;

      // for each file pair
      for (auto const& implicitPair : implicitPairs) {
        for (auto const& di : implicitPair.second) {
          cmakefileStream << "  \"" << di << "\" ";
          cmakefileStream << "\"" << implicitPair.first << "\"\n";
        }
      }
      cmakefileStream << "  )\n";

      // Tell the dependency scanner what compiler is used.
      std::string cidVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
      cmValue cid = this->Makefile->GetDefinition(cidVar);
      if (cmNonempty(cid)) {
        cmakefileStream << "set(CMAKE_" << lang << "_COMPILER_ID \"" << *cid
                        << "\")\n";
      }

      if (lang == "Fortran") {
        std::string smodSep =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
        std::string smodExt =
          this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_SEP \"" << smodSep
                        << "\")\n";
        cmakefileStream << "set(CMAKE_Fortran_SUBMODULE_EXT \"" << smodExt
                        << "\")\n";
      }

      // Build a list of preprocessor definitions for the target.
      std::set<std::string> defines;
      this->GetTargetDefines(target, this->GetConfigName(), lang, defines);
      if (!defines.empty()) {
        /* clang-format off */
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << lang << "\n";
        /* clang-format on */
        for (std::string const& define : defines) {
          cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(define)
                          << "\n";
        }
        cmakefileStream << "  )\n";
      }

      // Target-specific include directories:
      cmakefileStream << "\n"
                      << "# The include file search paths:\n";
      cmakefileStream << "set(CMAKE_" << lang << "_TARGET_INCLUDE_PATH\n";
      std::vector<std::string> includes;

      this->GetIncludeDirectories(includes, target, lang,
                                  this->GetConfigName());
      std::string const& binaryDir = this->GetState()->GetBinaryDirectory();
      if (this->Makefile->IsOn("CMAKE_DEPENDS_IN_PROJECT_ONLY")) {
        std::string const& sourceDir = this->GetState()->GetSourceDirectory();
        cm::erase_if(includes, ::NotInProjectDir(sourceDir, binaryDir));
      }
      for (std::string const& include : includes) {
        cmakefileStream << "  \"" << this->MaybeRelativeToTopBinDir(include)
                        << "\"\n";
      }
      cmakefileStream << "  )\n";
    }

    // Store include transform rule properties.  Write the directory
    // rules first because they may be overridden by later target rules.
    std::vector<std::string> transformRules;
    if (cmValue xform =
          this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (cmValue xform =
          target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")) {
      cmExpandList(*xform, transformRules);
    }
    if (!transformRules.empty()) {
      cmakefileStream << "\nset(CMAKE_INCLUDE_TRANSFORMS\n";
      for (std::string const& tr : transformRules) {
        cmakefileStream << "  " << cmOutputConverter::EscapeForCMake(tr)
                        << "\n";
      }
      cmakefileStream << "  )\n";
    }
  }

  auto const& compilerLangs =
    this->GetImplicitDepends(target, cmDependencyScannerKind::Compiler);

  // list the dependency files managed by the compiler
  cmakefileStream << "\n# The set of dependency files which are needed:\n";
  cmakefileStream << "set(CMAKE_DEPENDS_DEPENDENCY_FILES\n";
  for (auto const& compilerLang : compilerLangs) {
    auto const& compilerPairs = compilerLang.second;
    if (compilerLang.first == "CUSTOM"_s) {
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << R"(  "" ")"
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << R"(" "custom" ")"
                          << this->MaybeRelativeToTopBinDir(src) << "\"\n";
        }
      }
    } else {
      auto depFormat = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", compilerLang.first, "_DEPFILE_FORMAT"));
      for (auto const& compilerPair : compilerPairs) {
        for (auto const& src : compilerPair.second) {
          cmakefileStream << "  \"" << src << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << "\" \"" << depFormat << "\" \""
                          << this->MaybeRelativeToTopBinDir(compilerPair.first)
                          << ".d\"\n";
        }
      }
    }
  }
  cmakefileStream << "  )\n";
}